

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strife_sbar.cpp
# Opt level: O0

void __thiscall FHealthBar::MakeTexture(FHealthBar *this)

{
  int max;
  int stop;
  FHealthBar *this_local;
  
  if (this->VialLevel == 999) {
    FillBar(this,0,100,this->Colors[4],this->Colors[5]);
  }
  else if (this->VialLevel < 0x65) {
    if (this->VialLevel < 0xb) {
      FillBar(this,0,this->VialLevel,this->Colors[6],this->Colors[7]);
    }
    else if (this->VialLevel < 0x15) {
      FillBar(this,0,this->VialLevel,this->Colors[4],this->Colors[5]);
    }
    else {
      FillBar(this,0,this->VialLevel,this->Colors[0],this->Colors[1]);
    }
    FillBar(this,this->VialLevel,100,'\0','\0');
  }
  else {
    max = 100 - (this->VialLevel + -100);
    FillBar(this,0,max,this->Colors[0],this->Colors[1]);
    FillBar(this,max,100,this->Colors[2],this->Colors[3]);
  }
  return;
}

Assistant:

void FHealthBar::MakeTexture ()
{
	if (VialLevel == 999)
	{
		FillBar (0, 100, Colors[4], Colors[5]);
	}
	else
	{
		if (VialLevel <= 100)
		{
			if (VialLevel <= 10)
			{
				FillBar (0, VialLevel, Colors[6], Colors[7]);
			}
			else if (VialLevel <= 20)
			{
				FillBar (0, VialLevel, Colors[4], Colors[5]);
			}
			else
			{
				FillBar (0, VialLevel, Colors[0], Colors[1]);
			}
			FillBar (VialLevel, 100, 0, 0);
		}
		else
		{
			int stop = 100 - (VialLevel - 100);
			FillBar (0, stop, Colors[0], Colors[1]);
			FillBar (stop, 100, Colors[2], Colors[3]);
		}
	}
}